

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O3

string * decode(string *__return_storage_ptr__,string *stringToDecode)

{
  char *pcVar1;
  undefined8 uVar2;
  string_view str;
  int iVar3;
  string *psVar4;
  string *extraout_RAX;
  string *psVar5;
  size_t in_R8;
  json jVar6;
  string_view encoded_string;
  string_view jsonString;
  value_t in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffc9;
  
  if (stringToDecode->_M_string_length == 0) {
    psVar5 = (string *)&__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)psVar5;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    str._M_str._0_1_ = in_stack_ffffffffffffffc8;
    str._M_len = 0x27250e;
    str._M_str._1_7_ = in_stack_ffffffffffffffc9;
    iVar3 = hasB64Wrapper(str);
    if (iVar3 != 0) {
      if ((stringToDecode->_M_dataplus)._M_p[stringToDecode->_M_string_length - 1] == '\"') {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   stringToDecode);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)stringToDecode
                );
      encoded_string._M_str._0_4_ = iVar3;
      encoded_string._M_len = (size_t)(stringToDecode->_M_dataplus)._M_p;
      encoded_string._M_str._4_4_ = 0;
      psVar4 = gmlc::utilities::base64_decode_to_string_abi_cxx11_
                         ((string *)__return_storage_ptr__,
                          (utilities *)stringToDecode->_M_string_length,encoded_string,in_R8);
      return (string *)psVar4;
    }
    pcVar1 = (stringToDecode->_M_dataplus)._M_p;
    if ((*pcVar1 == '\'') || (*pcVar1 == '\"')) {
      jsonString._M_str = (char *)stringToDecode->_M_string_length;
      jsonString._M_len = (size_t)&stack0xffffffffffffffc8;
      jVar6 = helics::fileops::loadJsonStr_abi_cxx11_(jsonString);
      if (in_stack_ffffffffffffffc8 == string) {
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (__return_storage_ptr__,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&stack0xffffffffffffffc8,jVar6.m_data.m_value.object);
      }
      else {
        helics::fileops::generateJsonString
                  ((string *)__return_storage_ptr__,(json *)&stack0xffffffffffffffc8,true);
      }
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data((data *)&stack0xffffffffffffffc8);
      psVar5 = extraout_RAX;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar5 = (string *)&stringToDecode->field_2;
      if ((string *)pcVar1 == psVar5) {
        uVar2 = *(undefined8 *)((long)&stringToDecode->field_2 + 8);
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *(size_type *)psVar5;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar2;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = pcVar1;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *(size_type *)psVar5;
      }
      __return_storage_ptr__->_M_string_length = stringToDecode->_M_string_length;
      (stringToDecode->_M_dataplus)._M_p = (pointer)psVar5;
      stringToDecode->_M_string_length = 0;
      (stringToDecode->field_2)._M_local_buf[0] = '\0';
    }
  }
  return psVar5;
}

Assistant:

static std::string decode(std::string&& stringToDecode)
{
    if (stringToDecode.empty()) {
        return std::string();
    }
    auto offset = hasB64Wrapper(stringToDecode);
    if (offset != 0) {
        if (stringToDecode.back() == '\"') {
            stringToDecode.pop_back();
        }

        stringToDecode.pop_back();
        return gmlc::utilities::base64_decode_to_string(stringToDecode, offset);
    }

    if ((stringToDecode.front() == '"') || (stringToDecode.front() == '\'')) {
        try {
            return helics::fileops::JsonAsString(helics::fileops::loadJsonStr(stringToDecode));
        }
        catch (const nlohmann::json::exception&) {
            return gmlc::utilities::stringOps::removeQuotes(stringToDecode);
        }
    }
    // move is required since you are returning the rvalue and we want to move from the rvalue input
    return std::move(stringToDecode);
}